

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

UString * __thiscall jsonnet::internal::Token::data32_abi_cxx11_(Token *this)

{
  UString *in_RDI;
  string *in_stack_00000028;
  
  decode_utf8(in_stack_00000028);
  return in_RDI;
}

Assistant:

UString data32(void) const
    {
        return decode_utf8(data);
    }